

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_adaptcontroller.c
# Opt level: O2

SUNErrCode SUNAdaptController_Destroy(SUNAdaptController C)

{
  SUNErrCode SVar1;
  SUNAdaptController_Ops __ptr;
  
  if (C != (SUNAdaptController)0x0) {
    __ptr = C->ops;
    if ((__ptr != (SUNAdaptController_Ops)0x0) &&
       (__ptr->destroy != (_func_SUNErrCode_SUNAdaptController *)0x0)) {
      SVar1 = (*__ptr->destroy)(C);
      return SVar1;
    }
    if (C->content != (void *)0x0) {
      free(C->content);
      C->content = (void *)0x0;
      __ptr = C->ops;
    }
    free(__ptr);
    free(C);
  }
  return 0;
}

Assistant:

SUNErrCode SUNAdaptController_Destroy(SUNAdaptController C)
{
  if (C == NULL) { return (SUN_SUCCESS); }

  /* if the destroy operation exists use it */
  if (C->ops)
  {
    if (C->ops->destroy) { return (C->ops->destroy(C)); }
  }

  /* if we reach this point, either ops == NULL or destroy == NULL,
     try to cleanup by freeing the content, ops, and matrix */
  if (C->content)
  {
    free(C->content);
    C->content = NULL;
  }
  if (C->ops)
  {
    free(C->ops);
    C->ops = NULL;
  }
  free(C);
  C = NULL;

  return (SUN_SUCCESS);
}